

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O2

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          BigInt<unsigned_int,_unsigned_long> *x)

{
  BigInt<unsigned_int,_unsigned_long> local_30;
  
  operator*(&local_30,x,&this->_q);
  BigInt<unsigned_int,_unsigned_long>::operator+=(&this->_p,&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  _simplify(this);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const TValue& x)
	{
		_p += x * _q;
		_simplify();
		return *this;
	}